

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

int lys_has_xpath(lys_node *node)

{
  uint8_t uVar1;
  LYS_NODE LVar2;
  lys_node *plVar3;
  
  if (node == (lys_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                  ,0xc5a,"int lys_has_xpath(const struct lys_node *)");
  }
  LVar2 = node->nodetype;
  switch(LVar2) {
  case LYS_CONTAINER:
    if (node[1].name != (char *)0x0) {
      return 1;
    }
    if (node->padding[2] != '\0') {
      return 1;
    }
    return 0;
  case LYS_CHOICE:
    goto switchD_001526c5_caseD_2;
  case LYS_CHOICE|LYS_CONTAINER:
  case LYS_LEAF|LYS_CONTAINER:
  case LYS_LEAF|LYS_CHOICE:
  case LYS_LEAF|LYS_CHOICE|LYS_CONTAINER:
    goto switchD_001526c5_caseD_3;
  case LYS_LEAF:
  case LYS_LEAFLIST:
switchD_001526c5_caseD_4:
    if (node[1].name != (char *)0x0) {
      return 1;
    }
    uVar1 = node->padding[3];
joined_r0x0015270d:
    if (uVar1 == '\0') {
      return 0;
    }
    return 1;
  }
  if (LVar2 == LYS_LIST) {
    if (node[1].name != (char *)0x0) {
      return 1;
    }
    uVar1 = node->padding[0];
    goto joined_r0x0015270d;
  }
  if (LVar2 == LYS_CASE) {
switchD_001526c5_caseD_2:
    plVar3 = (lys_node *)node[1].name;
  }
  else {
    if (((LVar2 == LYS_NOTIF) || (LVar2 == LYS_INPUT)) || (LVar2 == LYS_OUTPUT)) {
      if (node->padding[3] != '\0') {
        return 1;
      }
      return 0;
    }
    if (LVar2 == LYS_USES) goto switchD_001526c5_caseD_2;
    if (LVar2 == LYS_ANYDATA) goto switchD_001526c5_caseD_4;
    if (LVar2 != LYS_AUGMENT) {
      return 0;
    }
    plVar3 = node->next;
  }
  if (plVar3 != (lys_node *)0x0) {
    return 1;
  }
switchD_001526c5_caseD_3:
  return 0;
}

Assistant:

int
lys_has_xpath(const struct lys_node *node)
{
    assert(node);

    switch (node->nodetype) {
    case LYS_AUGMENT:
        if (((struct lys_node_augment *)node)->when) {
            return 1;
        }
        break;
    case LYS_CASE:
        if (((struct lys_node_case *)node)->when) {
            return 1;
        }
        break;
    case LYS_CHOICE:
        if (((struct lys_node_choice *)node)->when) {
            return 1;
        }
        break;
    case LYS_ANYDATA:
        if (((struct lys_node_anydata *)node)->when || ((struct lys_node_anydata *)node)->must_size) {
            return 1;
        }
        break;
    case LYS_LEAF:
        if (((struct lys_node_leaf *)node)->when || ((struct lys_node_leaf *)node)->must_size) {
            return 1;
        }
        break;
    case LYS_LEAFLIST:
        if (((struct lys_node_leaflist *)node)->when || ((struct lys_node_leaflist *)node)->must_size) {
            return 1;
        }
        break;
    case LYS_LIST:
        if (((struct lys_node_list *)node)->when || ((struct lys_node_list *)node)->must_size) {
            return 1;
        }
        break;
    case LYS_CONTAINER:
        if (((struct lys_node_container *)node)->when || ((struct lys_node_container *)node)->must_size) {
            return 1;
        }
        break;
    case LYS_INPUT:
    case LYS_OUTPUT:
        if (((struct lys_node_inout *)node)->must_size) {
            return 1;
        }
        break;
    case LYS_NOTIF:
        if (((struct lys_node_notif *)node)->must_size) {
            return 1;
        }
        break;
    case LYS_USES:
        if (((struct lys_node_uses *)node)->when) {
            return 1;
        }
        break;
    default:
        /* does not have XPath */
        break;
    }

    return 0;
}